

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4ae0::CBBTest_FlushASN1SetOf_Test::TestBody(CBBTest_FlushASN1SetOf_Test *this)

{
  pointer *ppuVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  bool bVar2;
  int iVar3;
  cbb_st *pcVar4;
  char *pcVar5;
  uchar *puVar6;
  size_type sVar7;
  uint8_t *puVar8;
  size_t sVar9;
  char *in_R9;
  __0 *local_8e8;
  pointer *local_8d0;
  string local_760;
  AssertHelper local_740;
  Message local_738;
  bool local_729;
  undefined1 local_728 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_6f8;
  Message local_6f0;
  int local_6e4;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_6b0;
  Message local_6a8;
  int local_69c;
  undefined1 local_698 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_668;
  Message local_660;
  int local_654;
  undefined1 local_650 [8];
  AssertionResult gtest_ar__6;
  CBB child_1;
  ScopedCBB cbb_1;
  Bytes local_5d0;
  ScopedTrace local_5b9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_5b8;
  ScopedTrace gtest_trace_1481;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *t_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__end1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__begin1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> (*__range1_1) [3];
  iterator local_590;
  size_type local_588;
  allocator<unsigned_char> local_57b;
  uchar local_57a [2];
  iterator local_578;
  size_type local_570;
  allocator<unsigned_char> local_562;
  uchar local_561;
  iterator local_560;
  size_type local_558;
  pointer *local_550;
  undefined1 local_548 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> kInvalidInputs [3];
  AssertHelper local_4f8;
  Message local_4f0;
  int local_4e4;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_4b0;
  Message local_4a8;
  int local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__5;
  Message local_480;
  Bytes local_478;
  Span<const_unsigned_char> local_468;
  Bytes local_458;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_418;
  Message local_410;
  int local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__4;
  Message local_3e8;
  Bytes local_3e0;
  Span<const_unsigned_char> local_3d0;
  Bytes local_3c0;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_380;
  Message local_378;
  int local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_338;
  Message local_330;
  int local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_2f0;
  Message local_2e8;
  int local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__1;
  string local_2c0;
  AssertHelper local_2a0;
  Message local_298;
  int local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_;
  CBB child;
  ScopedCBB cbb;
  Bytes local_208;
  ScopedTrace local_1f1;
  anon_struct_48_2_766055b3 *paStack_1f0;
  ScopedTrace gtest_trace_1455;
  anon_struct_48_2_766055b3 *t;
  anon_struct_48_2_766055b3 *__end1;
  anon_struct_48_2_766055b3 *__begin1;
  anon_struct_48_2_766055b3 (*__range1) [4];
  uchar local_1c8 [40];
  iterator local_1a0;
  size_type local_198;
  allocator<unsigned_char> local_189;
  uchar local_188 [40];
  iterator local_160;
  size_type local_158;
  undefined1 local_14e;
  allocator<unsigned_char> local_14d;
  uchar local_14c [4];
  iterator local_148;
  size_type local_140;
  allocator<unsigned_char> local_135;
  uchar local_134 [4];
  iterator local_130;
  size_type local_128;
  undefined1 local_11c;
  allocator<unsigned_char> local_11b;
  uchar local_11a [2];
  iterator local_118;
  size_type local_110;
  allocator<unsigned_char> local_f3;
  uchar local_f2 [2];
  iterator local_f0;
  size_type local_e8;
  pointer *local_e0;
  undefined1 auStack_d8 [8];
  anon_struct_48_2_766055b3 kValidInputs [4];
  CBBTest_FlushASN1SetOf_Test *this_local;
  
  __range1._5_1_ = 1;
  local_e0 = (pointer *)auStack_d8;
  auStack_d8 = (undefined1  [8])0x0;
  kValidInputs[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  kValidInputs[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
  kValidInputs[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  kValidInputs[0].out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  kValidInputs[0].out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &kValidInputs[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ppuVar1 = &kValidInputs[0].out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f2[0] = '0';
  local_f2[1] = 0;
  local_f0 = local_f2;
  local_e8 = 2;
  local_e0 = ppuVar1;
  std::allocator<unsigned_char>::allocator(&local_f3);
  __l_07._M_len = local_e8;
  __l_07._M_array = local_f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l_07,&local_f3);
  local_11c = 1;
  local_11a[0] = '0';
  local_11a[1] = 0;
  local_118 = local_11a;
  local_110 = 2;
  std::allocator<unsigned_char>::allocator(&local_11b);
  __l_06._M_len = local_110;
  __l_06._M_array = local_118;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &kValidInputs[1].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,__l_06,&local_11b);
  local_11c = 0;
  ppuVar1 = &kValidInputs[1].out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_134[0] = '0';
  local_134[1] = 0;
  local_134[2] = 0x30;
  local_134[3] = 0;
  local_130 = local_134;
  local_128 = 4;
  local_e0 = ppuVar1;
  std::allocator<unsigned_char>::allocator(&local_135);
  __l_05._M_len = local_128;
  __l_05._M_array = local_130;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l_05,&local_135);
  local_14e = 1;
  local_14c[0] = '0';
  local_14c[1] = 0;
  local_14c[2] = 0x30;
  local_14c[3] = 0;
  local_148 = local_14c;
  local_140 = 4;
  std::allocator<unsigned_char>::allocator(&local_14d);
  __l_04._M_len = local_140;
  __l_04._M_array = local_148;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &kValidInputs[2].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,__l_04,&local_14d);
  local_14e = 0;
  ppuVar1 = &kValidInputs[2].out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_188[0x10] = '\0';
  local_188[0x11] = '0';
  local_188[0x12] = '\0';
  local_188[0x13] = '0';
  local_188[0x14] = '\x03';
  local_188[0x15] = '\0';
  local_188[0x16] = '\0';
  local_188[0x17] = '\x01';
  local_188[0x18] = '0';
  local_188[0x19] = '\x01';
  local_188[0x1a] = '\0';
  local_188[0x1b] = '\x01';
  local_188[0x1c] = '\x01';
  local_188[0x1d] = '\0';
  local_188[0] = '0';
  local_188[1] = '\x02';
  local_188[2] = '\0';
  local_188[3] = '\0';
  local_188[4] = '0';
  local_188[5] = '\0';
  local_188[6] = '\x01';
  local_188[7] = '\0';
  local_188[8] = '0';
  local_188[9] = '\x02';
  local_188[10] = '\0';
  local_188[0xb] = '\0';
  local_188[0xc] = '0';
  local_188[0xd] = '\x03';
  local_188[0xe] = '\0';
  local_188[0xf] = '\0';
  local_160 = local_188;
  local_158 = 0x1e;
  local_e0 = ppuVar1;
  std::allocator<unsigned_char>::allocator(&local_189);
  __l_03._M_len = local_158;
  __l_03._M_array = local_160;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l_03,&local_189);
  __range1._6_1_ = 1;
  local_1c8[0x10] = '0';
  local_1c8[0x11] = '\x02';
  local_1c8[0x12] = '\0';
  local_1c8[0x13] = '\0';
  local_1c8[0x14] = '0';
  local_1c8[0x15] = '\x03';
  local_1c8[0x16] = '\0';
  local_1c8[0x17] = '\0';
  local_1c8[0x18] = '\0';
  local_1c8[0x19] = '0';
  local_1c8[0x1a] = '\x03';
  local_1c8[0x1b] = '\0';
  local_1c8[0x1c] = '\0';
  local_1c8[0x1d] = '\x01';
  local_1c8[0] = '\x01';
  local_1c8[1] = '\0';
  local_1c8[2] = '\x01';
  local_1c8[3] = '\x01';
  local_1c8[4] = '\0';
  local_1c8[5] = '0';
  local_1c8[6] = '\0';
  local_1c8[7] = '0';
  local_1c8[8] = '\0';
  local_1c8[9] = '0';
  local_1c8[10] = '\x01';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = '0';
  local_1c8[0xd] = '\x02';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = '\0';
  local_1a0 = local_1c8;
  local_198 = 0x1e;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range1 + 7));
  __l_02._M_len = local_198;
  __l_02._M_array = local_1a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &kValidInputs[3].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,__l_02,
             (allocator<unsigned_char> *)((long)&__range1 + 7));
  __range1._6_1_ = 0;
  __range1._5_1_ = 0;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range1 + 7));
  std::allocator<unsigned_char>::~allocator(&local_189);
  std::allocator<unsigned_char>::~allocator(&local_14d);
  std::allocator<unsigned_char>::~allocator(&local_135);
  std::allocator<unsigned_char>::~allocator(&local_11b);
  std::allocator<unsigned_char>::~allocator(&local_f3);
  for (__end1 = (anon_struct_48_2_766055b3 *)auStack_d8;
      __end1 != (anon_struct_48_2_766055b3 *)
                &kValidInputs[3].out.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage; __end1 = __end1 + 1) {
    paStack_1f0 = __end1;
    bssl::Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)((long)&cbb.ctx_.u + 0x18),&__end1->in);
    Bytes::Bytes(&local_208,stack0xfffffffffffffde8);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_1f1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x5af,&local_208);
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&child.u + 0x18));
    pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&child.u + 0x18));
    local_28c = CBB_init(pcVar4,0);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_288,&local_28c,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
    if (!bVar2) {
      testing::Message::Message(&local_298);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2c0,(internal *)local_288,(AssertionResult *)"CBB_init(cbb.get(), 0)",
                 "false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5b3,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
      testing::internal::AssertHelper::~AssertHelper(&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      testing::Message::~Message(&local_298);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&child.u + 0x18));
      local_2dc = CBB_add_asn1(pcVar4,(CBB *)&gtest_ar_.message_,0x20000011);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_2d8,&local_2dc,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
      if (!bVar2) {
        testing::Message::Message(&local_2e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_2d8,
                   (AssertionResult *)"CBB_add_asn1(cbb.get(), &child, (0x11u | (0x20u << 24)))",
                   "false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x5b4,pcVar5);
        testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
        testing::internal::AssertHelper::~AssertHelper(&local_2f0);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_2e8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_1f0->in);
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_1f0->in);
        local_324 = CBB_add_bytes((CBB *)&gtest_ar_.message_,puVar6,sVar7);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_320,&local_324,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
        if (!bVar2) {
          testing::Message::Message(&local_330);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_320,
                     (AssertionResult *)"CBB_add_bytes(&child, t.in.data(), t.in.size())","false",
                     "true",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_338,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x5b5,pcVar5);
          testing::internal::AssertHelper::operator=(&local_338,&local_330);
          testing::internal::AssertHelper::~AssertHelper(&local_338);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_330);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_36c = CBB_flush_asn1_set_of((CBB *)&gtest_ar_.message_);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_368,&local_36c,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
          if (!bVar2) {
            testing::Message::Message(&local_378);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_368,
                       (AssertionResult *)"CBB_flush_asn1_set_of(&child)","false","true",in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_380,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x5b6,pcVar5);
            testing::internal::AssertHelper::operator=(&local_380,&local_378);
            testing::internal::AssertHelper::~AssertHelper(&local_380);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_378);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_3d0,&paStack_1f0->out);
            Bytes::Bytes(&local_3c0,local_3d0);
            puVar8 = CBB_data((CBB *)&gtest_ar_.message_);
            sVar9 = CBB_len((CBB *)&gtest_ar_.message_);
            Bytes::Bytes(&local_3e0,puVar8,sVar9);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_3b0,"Bytes(t.out)",
                       "Bytes(CBB_data(&child), CBB_len(&child))",&local_3c0,&local_3e0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
            if (!bVar2) {
              testing::Message::Message(&local_3e8);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x5b7,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__4.message_,&local_3e8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
              testing::Message::~Message(&local_3e8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
            local_404 = CBB_flush_asn1_set_of((CBB *)&gtest_ar_.message_);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_400,&local_404,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
            if (!bVar2) {
              testing::Message::Message(&local_410);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_1.message_,(internal *)local_400,
                         (AssertionResult *)"CBB_flush_asn1_set_of(&child)","false","true",in_R9);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_418,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x5ba,pcVar5);
              testing::internal::AssertHelper::operator=(&local_418,&local_410);
              testing::internal::AssertHelper::~AssertHelper(&local_418);
              std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              testing::Message::~Message(&local_410);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              bssl::Span<unsigned_char_const>::
              Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((Span<unsigned_char_const> *)&local_468,&paStack_1f0->out);
              Bytes::Bytes(&local_458,local_468);
              puVar8 = CBB_data((CBB *)&gtest_ar_.message_);
              sVar9 = CBB_len((CBB *)&gtest_ar_.message_);
              Bytes::Bytes(&local_478,puVar8,sVar9);
              testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                        ((EqHelper *)local_448,"Bytes(t.out)",
                         "Bytes(CBB_data(&child), CBB_len(&child))",&local_458,&local_478);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
              if (!bVar2) {
                testing::Message::Message(&local_480);
                pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                           ,0x5bb,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__5.message_,&local_480);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__5.message_);
                testing::Message::~Message(&local_480);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
              pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  ((long)&child.u + 0x18));
              local_49c = CBB_flush(pcVar4);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_498,&local_49c,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
              if (!bVar2) {
                testing::Message::Message(&local_4a8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_2.message_,(internal *)local_498,
                           (AssertionResult *)"CBB_flush(cbb.get())","false","true",in_R9);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_4b0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                           ,0x5be,pcVar5);
                testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
                testing::internal::AssertHelper::~AssertHelper(&local_4b0);
                std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
                testing::Message::~Message(&local_4a8);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_4e4 = 0x31;
                pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                   ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                    ((long)&child.u + 0x18));
                puVar8 = CBB_data(pcVar4);
                testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
                          ((EqHelper *)local_4e0,"0x31","CBB_data(cbb.get())[0]",&local_4e4,puVar8);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_4e0);
                if (!bVar2) {
                  testing::Message::Message(&local_4f0);
                  pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_4f8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                             ,0x5bf,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
                  testing::internal::AssertHelper::~AssertHelper(&local_4f8);
                  testing::Message::~Message(&local_4f0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ = 0;
              }
            }
          }
        }
      }
    }
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&child.u + 0x18));
    testing::ScopedTrace::~ScopedTrace(&local_1f1);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_002a2fde;
  }
  __range1_1._0_1_ = 1;
  local_561 = '0';
  local_560 = &local_561;
  local_558 = 1;
  local_550 = (pointer *)local_548;
  std::allocator<unsigned_char>::allocator(&local_562);
  __l_01._M_len = local_558;
  __l_01._M_array = local_560;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_548,__l_01,&local_562);
  ppuVar1 = &kInvalidInputs[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_57a[0] = '0';
  local_57a[1] = 1;
  local_578 = local_57a;
  local_570 = 2;
  local_550 = ppuVar1;
  std::allocator<unsigned_char>::allocator(&local_57b);
  __l_00._M_len = local_570;
  __l_00._M_array = local_578;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l_00,&local_57b);
  ppuVar1 = &kInvalidInputs[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  __range1_1._2_1_ = 0x30;
  __range1_1._3_1_ = 0;
  __range1_1._4_1_ = 0x30;
  __range1_1._5_1_ = 0;
  __range1_1._6_1_ = 0x30;
  __range1_1._7_1_ = 1;
  local_590 = (iterator)((long)&__range1_1 + 2);
  local_588 = 6;
  local_550 = ppuVar1;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range1_1 + 1));
  __l._M_len = local_588;
  __l._M_array = local_590;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,__l,
             (allocator<unsigned_char> *)((long)&__range1_1 + 1));
  __range1_1._0_1_ = 0;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range1_1 + 1));
  std::allocator<unsigned_char>::~allocator(&local_57b);
  std::allocator<unsigned_char>::~allocator(&local_562);
  for (__end1_1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_548;
      __end1_1 !=
      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
      &kInvalidInputs[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage; __end1_1 = __end1_1 + 1) {
    pvStack_5b8 = __end1_1;
    bssl::Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)((long)&cbb_1.ctx_.u + 0x18),__end1_1);
    Bytes::Bytes(&local_5d0,stack0xfffffffffffffa20);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_5b9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x5c9,&local_5d0);
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&child_1.u + 0x18));
    pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&child_1.u + 0x18));
    local_654 = CBB_init(pcVar4,0);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_650,&local_654,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_650);
    if (!bVar2) {
      testing::Message::Message(&local_660);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__7.message_,(internal *)local_650,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_668,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5cd,pcVar5);
      testing::internal::AssertHelper::operator=(&local_668,&local_660);
      testing::internal::AssertHelper::~AssertHelper(&local_668);
      std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
      testing::Message::~Message(&local_660);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pcVar4 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&child_1.u + 0x18));
      local_69c = CBB_add_asn1(pcVar4,(CBB *)&gtest_ar__6.message_,0x20000011);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_698,&local_69c,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
      if (!bVar2) {
        testing::Message::Message(&local_6a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__8.message_,(internal *)local_698,
                   (AssertionResult *)"CBB_add_asn1(cbb.get(), &child, (0x11u | (0x20u << 24)))",
                   "false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_6b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x5ce,pcVar5);
        testing::internal::AssertHelper::operator=(&local_6b0,&local_6a8);
        testing::internal::AssertHelper::~AssertHelper(&local_6b0);
        std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
        testing::Message::~Message(&local_6a8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvStack_5b8);
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_5b8);
        local_6e4 = CBB_add_bytes((CBB *)&gtest_ar__6.message_,puVar6,sVar7);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_6e0,&local_6e4,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
        if (!bVar2) {
          testing::Message::Message(&local_6f0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__9.message_,(internal *)local_6e0,
                     (AssertionResult *)"CBB_add_bytes(&child, t.data(), t.size())","false","true",
                     in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_6f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x5cf,pcVar5);
          testing::internal::AssertHelper::operator=(&local_6f8,&local_6f0);
          testing::internal::AssertHelper::~AssertHelper(&local_6f8);
          std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
          testing::Message::~Message(&local_6f0);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          iVar3 = CBB_flush_asn1_set_of((CBB *)&gtest_ar__6.message_);
          local_729 = iVar3 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_728,&local_729,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
          if (!bVar2) {
            testing::Message::Message(&local_738);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_760,(internal *)local_728,
                       (AssertionResult *)"CBB_flush_asn1_set_of(&child)","true","false",in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_740,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x5d0,pcVar5);
            testing::internal::AssertHelper::operator=(&local_740,&local_738);
            testing::internal::AssertHelper::~AssertHelper(&local_740);
            std::__cxx11::string::~string((string *)&local_760);
            testing::Message::~Message(&local_738);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
      }
    }
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&child_1.u + 0x18));
    testing::ScopedTrace::~ScopedTrace(&local_5b9);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_002a2f92;
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
LAB_002a2f92:
  local_8d0 = &kInvalidInputs[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_8d0 = local_8d0 + -3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8d0);
  } while (local_8d0 != (pointer *)local_548);
LAB_002a2fde:
  local_8e8 = (__0 *)&kValidInputs[3].out.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  do {
    local_8e8 = local_8e8 + -0x30;
    (anonymous_namespace)::CBBTest_FlushASN1SetOf_Test::TestBody()::$_0::~__0(local_8e8);
  } while (local_8e8 != (__0 *)auStack_d8);
  return;
}

Assistant:

TEST(CBBTest, FlushASN1SetOf) {
  const struct {
    std::vector<uint8_t> in, out;
  } kValidInputs[] = {
      // No elements.
      {{}, {}},
      // One element.
      {{0x30, 0x00}, {0x30, 0x00}},
      // Two identical elements.
      {{0x30, 0x00, 0x30, 0x00}, {0x30, 0x00, 0x30, 0x00}},
      // clang-format off
    {{0x30, 0x02, 0x00, 0x00,
      0x30, 0x00,
      0x01, 0x00,
      0x30, 0x02, 0x00, 0x00,
      0x30, 0x03, 0x00, 0x00, 0x00,
      0x30, 0x00,
      0x30, 0x03, 0x00, 0x00, 0x01,
      0x30, 0x01, 0x00,
      0x01, 0x01, 0x00},
     {0x01, 0x00,
      0x01, 0x01, 0x00,
      0x30, 0x00,
      0x30, 0x00,
      0x30, 0x01, 0x00,
      0x30, 0x02, 0x00, 0x00,
      0x30, 0x02, 0x00, 0x00,
      0x30, 0x03, 0x00, 0x00, 0x00,
      0x30, 0x03, 0x00, 0x00, 0x01}},
      // clang-format on
  };

  for (const auto &t : kValidInputs) {
    SCOPED_TRACE(Bytes(t.in));

    bssl::ScopedCBB cbb;
    CBB child;
    ASSERT_TRUE(CBB_init(cbb.get(), 0));
    ASSERT_TRUE(CBB_add_asn1(cbb.get(), &child, CBS_ASN1_SET));
    ASSERT_TRUE(CBB_add_bytes(&child, t.in.data(), t.in.size()));
    ASSERT_TRUE(CBB_flush_asn1_set_of(&child));
    EXPECT_EQ(Bytes(t.out), Bytes(CBB_data(&child), CBB_len(&child)));

    // Running it again should be idempotent.
    ASSERT_TRUE(CBB_flush_asn1_set_of(&child));
    EXPECT_EQ(Bytes(t.out), Bytes(CBB_data(&child), CBB_len(&child)));

    // The ASN.1 header remain intact.
    ASSERT_TRUE(CBB_flush(cbb.get()));
    EXPECT_EQ(0x31, CBB_data(cbb.get())[0]);
  }

  const std::vector<uint8_t> kInvalidInputs[] = {
      {0x30},
      {0x30, 0x01},
      {0x30, 0x00, 0x30, 0x00, 0x30, 0x01},
  };

  for (const auto &t : kInvalidInputs) {
    SCOPED_TRACE(Bytes(t));

    bssl::ScopedCBB cbb;
    CBB child;
    ASSERT_TRUE(CBB_init(cbb.get(), 0));
    ASSERT_TRUE(CBB_add_asn1(cbb.get(), &child, CBS_ASN1_SET));
    ASSERT_TRUE(CBB_add_bytes(&child, t.data(), t.size()));
    EXPECT_FALSE(CBB_flush_asn1_set_of(&child));
  }
}